

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O0

ER __thiscall
slang::ast::ForeachLoopStatement::evalRecursive
          (ForeachLoopStatement *this,EvalContext *context,ConstantValue *cv,
          span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> currDims)

{
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> currDims_00;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> currDims_01;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> currDims_02;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> currDims_03;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  reference cv_00;
  ConstantValue *pCVar4;
  size_type sVar5;
  ConstantRange *pCVar6;
  size_type sVar7;
  __extent_storage<18446744073709551615UL> in_RCX;
  EvalContext *in_RDX;
  ForeachLoopStatement *in_RSI;
  pointer in_RDI;
  size_t index;
  ER result_3;
  int32_t i_2;
  bool isLittleEndian;
  ConstantRange range;
  span<const_slang::ConstantValue,_18446744073709551615UL> elements;
  ER result_2;
  size_t i_1;
  string *str;
  ER result_1;
  size_t i;
  SVQueue *q;
  ER result;
  type *val;
  type *key;
  const_iterator __end3;
  const_iterator __begin3;
  AssociativeArray *__range3;
  AssociativeArray *map;
  ConstantValue *local;
  LoopDim *dim;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  undefined4 in_stack_fffffffffffffcf0;
  ER in_stack_fffffffffffffcf4;
  ForeachLoopStatement *in_stack_fffffffffffffcf8;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
  *in_stack_fffffffffffffd00;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> *this_00;
  ConstantValue *in_stack_fffffffffffffd20;
  ValueSymbol *in_stack_fffffffffffffd28;
  EvalContext *in_stack_fffffffffffffd30;
  size_type local_230;
  ER local_224;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> local_220 [3];
  int32_t local_1e8;
  ConstantRange local_1e4;
  bool local_1d9;
  ConstantRange local_1d8;
  span<const_slang::ConstantValue,_18446744073709551615UL> local_1d0;
  span<const_slang::ConstantValue,_18446744073709551615UL> local_1c0;
  ER local_1ac;
  ulong local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> local_160;
  ER local_14c;
  ulong local_110;
  SVQueue *local_108;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> local_100;
  ER local_ec;
  type *local_e8;
  type *local_e0;
  reference local_d8;
  _Self local_d0;
  _Self local_c8;
  AssociativeArray *local_c0;
  AssociativeArray *local_b8;
  ConstantValue *local_88;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> local_70;
  ER local_4;
  
  cv_00 = std::span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::
          operator[]((span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
                      *)&stack0xffffffffffffffe8,0);
  if (cv_00->loopVar == (IteratorSymbol *)0x0) {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
               (nullptr_t)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
    local_70 = std::span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::
               subspan(in_stack_fffffffffffffd00,(size_type)in_stack_fffffffffffffcf8,
                       CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
    currDims_00._M_extent._M_extent_value = in_RCX._M_extent_value;
    currDims_00._M_ptr = in_RDI;
    local_4 = evalRecursive(in_RSI,in_RDX,(ConstantValue *)cv_00,currDims_00);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x86fb74);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
               (nullptr_t)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
    pCVar4 = EvalContext::createLocal
                       (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                        in_stack_fffffffffffffd20);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x86fbfe);
    local_88 = pCVar4;
    bVar2 = slang::ConstantValue::isMap((ConstantValue *)0x86fc1b);
    if (bVar2) {
      slang::ConstantValue::map((ConstantValue *)0x86fc31);
      local_c0 = CopyPtr<slang::AssociativeArray>::operator*
                           ((CopyPtr<slang::AssociativeArray> *)0x86fc39);
      local_b8 = local_c0;
      local_c8._M_node =
           (_Base_ptr)
           std::
           map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
           ::begin((map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                    *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
      local_d0._M_node =
           (_Base_ptr)
           std::
           map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
           ::end((map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                  *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
      while (bVar2 = std::operator==(&local_c8,&local_d0), ((bVar2 ^ 0xffU) & 1) != 0) {
        local_d8 = std::
                   _Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>
                   ::operator*((_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>
                                *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
        local_e0 = std::get<0ul,slang::ConstantValue_const,slang::ConstantValue>
                             ((pair<const_slang::ConstantValue,_slang::ConstantValue> *)0x86fcbd);
        local_e8 = std::get<1ul,slang::ConstantValue_const,slang::ConstantValue>
                             ((pair<const_slang::ConstantValue,_slang::ConstantValue> *)0x86fcd2);
        slang::ConstantValue::operator=
                  ((ConstantValue *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   (ConstantValue *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
        sVar7 = std::span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::
                size((span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
                      *)0x86fcfc);
        if (sVar7 < 2) {
          local_ec = Statement::eval((Statement *)
                                     CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                                     (EvalContext *)
                                     CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
        }
        else {
          local_100 = std::
                      span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
                      ::subspan(in_stack_fffffffffffffd00,(size_type)in_stack_fffffffffffffcf8,
                                CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
          currDims_01._M_extent._M_extent_value = in_RCX._M_extent_value;
          currDims_01._M_ptr = in_RDI;
          local_ec = evalRecursive(in_RSI,in_RDX,(ConstantValue *)cv_00,currDims_01);
        }
        if ((local_ec != Success) && (local_ec != Continue)) {
          return local_ec;
        }
        std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>::
        operator++((_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>
                    *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
      }
    }
    else {
      bVar2 = slang::ConstantValue::isQueue((ConstantValue *)0x86fe12);
      if (bVar2) {
        slang::ConstantValue::queue((ConstantValue *)0x86fe28);
        local_108 = CopyPtr<slang::SVQueue>::operator*((CopyPtr<slang::SVQueue> *)0x86fe30);
        for (local_110 = 0; uVar1 = local_110,
            sVar7 = std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::size
                              ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *
                               )0x86fe5e), uVar1 < sVar7; local_110 = local_110 + 1) {
          SVInt::SVInt((SVInt *)in_stack_fffffffffffffd00,
                       (bitwidth_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                       CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                       (bool)in_stack_fffffffffffffcef);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                     (SVInt *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
          slang::ConstantValue::operator=
                    ((ConstantValue *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                     (ConstantValue *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8))
          ;
          slang::ConstantValue::~ConstantValue((ConstantValue *)0x86fec9);
          SVInt::~SVInt((SVInt *)in_stack_fffffffffffffd00);
          sVar7 = std::span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
                  ::size((span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
                          *)0x86fee3);
          if (sVar7 < 2) {
            local_14c = Statement::eval((Statement *)
                                        CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0
                                                ),
                                        (EvalContext *)
                                        CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8
                                                ));
          }
          else {
            std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::operator[]
                      ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                       CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                       CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
            local_160 = std::
                        span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
                        ::subspan(in_stack_fffffffffffffd00,(size_type)in_stack_fffffffffffffcf8,
                                  CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
            currDims_02._M_extent._M_extent_value = in_RCX._M_extent_value;
            currDims_02._M_ptr = in_RDI;
            local_14c = evalRecursive(in_RSI,in_RDX,(ConstantValue *)cv_00,currDims_02);
          }
          if ((local_14c != Success) && (local_14c != Continue)) {
            return local_14c;
          }
        }
      }
      else {
        bVar2 = slang::ConstantValue::isString((ConstantValue *)0x87000d);
        if (bVar2) {
          local_168 = slang::ConstantValue::str_abi_cxx11_((ConstantValue *)0x870027);
          for (local_170 = 0; uVar1 = local_170,
              sVar5 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                (local_168), uVar1 < sVar5; local_170 = local_170 + 1) {
            SVInt::SVInt((SVInt *)in_stack_fffffffffffffd00,
                         (bitwidth_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                         CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                         (bool)in_stack_fffffffffffffcef);
            slang::ConstantValue::ConstantValue
                      ((ConstantValue *)
                       CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                       (SVInt *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
            slang::ConstantValue::operator=
                      ((ConstantValue *)
                       CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                       (ConstantValue *)
                       CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
            slang::ConstantValue::~ConstantValue((ConstantValue *)0x8700c0);
            SVInt::~SVInt((SVInt *)in_stack_fffffffffffffd00);
            local_1ac = Statement::eval((Statement *)
                                        CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0
                                                ),
                                        (EvalContext *)
                                        CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8
                                                ));
            if ((local_1ac != Success) && (local_1ac != Continue)) {
              return local_1ac;
            }
          }
        }
        else {
          std::span<const_slang::ConstantValue,_18446744073709551615UL>::span
                    ((span<const_slang::ConstantValue,_18446744073709551615UL> *)0x870167);
          bVar2 = slang::ConstantValue::isUnpacked((ConstantValue *)0x870174);
          if (bVar2) {
            local_1d0 = slang::ConstantValue::elements((ConstantValue *)0x870187);
            local_1c0._M_ptr = local_1d0._M_ptr;
            local_1c0._M_extent._M_extent_value = local_1d0._M_extent._M_extent_value;
          }
          ConstantRange::ConstantRange(&local_1d8);
          bVar2 = std::optional::operator_cast_to_bool((optional<slang::ConstantRange> *)0x8701d1);
          if (bVar2) {
            pCVar6 = std::optional<slang::ConstantRange>::operator*
                               ((optional<slang::ConstantRange> *)0x8701e4);
            local_1d8 = *pCVar6;
            local_1d9 = ConstantRange::isLittleEndian(&local_1d8);
          }
          else {
            sVar7 = std::span<const_slang::ConstantValue,_18446744073709551615UL>::size
                              ((span<const_slang::ConstantValue,_18446744073709551615UL> *)0x870214)
            ;
            ConstantRange::ConstantRange(&local_1e4,0,(int)sVar7 + -1);
            local_1d8 = local_1e4;
            local_1d9 = false;
          }
          local_1e8 = local_1d8.left;
          while( true ) {
            if ((local_1d9 & 1U) == 0) {
              bVar2 = local_1e8 <= local_1d8.right;
            }
            else {
              bVar2 = local_1d8.right <= local_1e8;
            }
            if (!bVar2) break;
            this_00 = local_220;
            SVInt::SVInt((SVInt *)this_00,(bitwidth_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                         CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                         (bool)in_stack_fffffffffffffcef);
            slang::ConstantValue::ConstantValue
                      ((ConstantValue *)
                       CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                       (SVInt *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
            slang::ConstantValue::operator=
                      ((ConstantValue *)
                       CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                       (ConstantValue *)
                       CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
            slang::ConstantValue::~ConstantValue((ConstantValue *)0x8702eb);
            SVInt::~SVInt((SVInt *)this_00);
            sVar7 = std::
                    span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::
                    size((span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>
                          *)0x870305);
            iVar3 = local_1e8;
            if (sVar7 < 2) {
              local_224 = Statement::eval((Statement *)
                                          CONCAT44(in_stack_fffffffffffffcf4,
                                                   in_stack_fffffffffffffcf0),
                                          (EvalContext *)
                                          CONCAT17(in_stack_fffffffffffffcef,
                                                   in_stack_fffffffffffffce8));
            }
            else {
              bVar2 = std::optional::operator_cast_to_bool
                                ((optional<slang::ConstantRange> *)0x87032c);
              if (bVar2) {
                ConstantRange::reverse
                          ((ConstantRange *)
                           CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
                iVar3 = ConstantRange::translateIndex
                                  ((ConstantRange *)in_stack_fffffffffffffcf8,
                                   in_stack_fffffffffffffcf4);
              }
              in_stack_fffffffffffffcf8 = in_RSI;
              local_230 = (size_type)iVar3;
              in_RSI = in_stack_fffffffffffffcf8;
              bVar2 = std::span<const_slang::ConstantValue,_18446744073709551615UL>::empty
                                ((span<const_slang::ConstantValue,_18446744073709551615UL> *)
                                 0x8703a7);
              if (bVar2) {
                slang::ConstantValue::ConstantValue
                          ((ConstantValue *)
                           CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                           (nullptr_t)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8))
                ;
              }
              else {
                std::span<const_slang::ConstantValue,_18446744073709551615UL>::operator[]
                          (&local_1c0,local_230);
                slang::ConstantValue::ConstantValue
                          ((ConstantValue *)
                           CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                           (ConstantValue *)
                           CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
              }
              std::span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::
              subspan(this_00,(size_type)in_stack_fffffffffffffcf8,
                      CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
              currDims_03._M_extent._M_extent_value = in_RCX._M_extent_value;
              currDims_03._M_ptr = in_RDI;
              local_224 = evalRecursive(in_RSI,in_RDX,(ConstantValue *)cv_00,currDims_03);
              in_stack_fffffffffffffcf4 = local_224;
              slang::ConstantValue::~ConstantValue((ConstantValue *)0x870456);
            }
            if ((local_224 != Success) && (local_224 != Continue)) {
              return local_224;
            }
            if ((local_1d9 & 1U) == 0) {
              local_1e8 = local_1e8 + 1;
            }
            else {
              local_1e8 = local_1e8 + -1;
            }
          }
        }
      }
    }
    local_4 = Success;
  }
  return local_4;
}

Assistant:

ER ForeachLoopStatement::evalRecursive(EvalContext& context, const ConstantValue& cv,
                                       std::span<const LoopDim> currDims) const {
    // If there is no loop var just skip this index.
    auto& dim = currDims[0];
    if (!dim.loopVar) {
        // Shouldn't ever be at the end here.
        return evalRecursive(context, nullptr, currDims.subspan(1));
    }

    auto local = context.createLocal(dim.loopVar);

    // If this is an associative array, looping happens over the keys.
    if (cv.isMap()) {
        auto& map = *cv.map();
        for (auto& [key, val] : map) {
            *local = key;

            ER result;
            if (currDims.size() > 1)
                result = evalRecursive(context, val, currDims.subspan(1));
            else
                result = body.eval(context);

            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }
    else if (cv.isQueue()) {
        auto& q = *cv.queue();
        for (size_t i = 0; i < q.size(); i++) {
            *local = SVInt(32, i, true);

            ER result;
            if (currDims.size() > 1)
                result = evalRecursive(context, q[i], currDims.subspan(1));
            else
                result = body.eval(context);

            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }
    else if (cv.isString()) {
        SLANG_ASSERT(currDims.size() == 1);

        auto& str = cv.str();
        for (size_t i = 0; i < str.size(); i++) {
            *local = SVInt(32, i, true);

            ER result = body.eval(context);
            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }
    else {
        std::span<const ConstantValue> elements;
        if (cv.isUnpacked())
            elements = cv.elements();

        ConstantRange range;
        bool isLittleEndian;
        if (dim.range) {
            range = *dim.range;
            isLittleEndian = range.isLittleEndian();
        }
        else {
            range = {0, int32_t(elements.size()) - 1};
            isLittleEndian = false;
        }

        for (int32_t i = range.left; isLittleEndian ? i >= range.right : i <= range.right;
             isLittleEndian ? i-- : i++) {

            *local = SVInt(32, uint64_t(i), true);

            ER result;
            if (currDims.size() > 1) {
                size_t index = size_t(i);
                if (dim.range)
                    index = (size_t)range.reverse().translateIndex(i);

                result = evalRecursive(context, elements.empty() ? nullptr : elements[index],
                                       currDims.subspan(1));
            }
            else {
                result = body.eval(context);
            }

            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }

    return ER::Success;
}